

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowState>::
emplaceRealloc<slang::analysis::DataFlowState>
          (SmallVectorBase<slang::analysis::DataFlowState> *this,pointer pos,DataFlowState *args)

{
  ulong uVar1;
  size_type sVar2;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *pSVar3;
  pointer pDVar4;
  long lVar5;
  DataFlowState *pDVar6;
  DataFlowState *ctx;
  pointer pDVar7;
  DataFlowState *other;
  ulong uVar8;
  
  if (this->len == 0xcccccccccccccc) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0xcccccccccccccc - uVar1 < uVar1) {
    uVar8 = 0xcccccccccccccc;
  }
  lVar5 = (long)pos - (long)this->data_;
  pDVar4 = (pointer)operator_new(uVar8 * 0xa0);
  ctx = args;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            ((SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
             ((long)pDVar4 + lVar5),(Base *)args);
  *(bool *)((long)pDVar4 + lVar5 + 0x98) = args->reachable;
  other = this->data_;
  pDVar6 = other + this->len;
  pDVar7 = pDVar4;
  if (pDVar6 == pos) {
    if (this->len != 0) {
      do {
        ctx = other;
        SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                  (&pDVar7->assigned,(Base *)other);
        pDVar7->reachable = other->reachable;
        other = other + 1;
        pDVar7 = pDVar7 + 1;
      } while (other != pDVar6);
    }
  }
  else {
    for (; other != pos; other = other + 1) {
      ctx = other;
      SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                (&pDVar7->assigned,(Base *)other);
      pDVar7->reachable = other->reachable;
      pDVar7 = pDVar7 + 1;
    }
    sVar2 = this->len;
    pDVar7 = this->data_;
    if (pDVar7 + sVar2 != pos) {
      pSVar3 = (SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
               (lVar5 + (long)pDVar4);
      do {
        ctx = pos;
        SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                  ((SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
                   ((long)(pSVar3 + 1) + 8U),(Base *)pos);
        *(bool *)((long)(pSVar3 + 2) + 8) = pos->reachable;
        pos = pos + 1;
        pSVar3 = (SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)
                 ((long)(pSVar3 + 1) + 8U);
      } while (pos != pDVar7 + sVar2);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = uVar8;
  this->data_ = pDVar4;
  return (pointer)((long)pDVar4 + lVar5);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}